

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::MinerPrivate::~MinerPrivate(MinerPrivate *this)

{
  bool bVar1;
  reference ppIVar2;
  long in_RDI;
  IBackend *backend;
  iterator __end2;
  iterator __begin2;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range2;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *in_stack_ffffffffffffffb8;
  Job *in_stack_ffffffffffffffc0;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *this_00;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_18;
  long local_10;
  
  this_00 = *(vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> **)(in_RDI + 0x148);
  if (this_00 != (vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)0x0) {
    Timer::~Timer((Timer *)0x230daf);
    operator_delete(this_00);
  }
  local_10 = in_RDI + 0x120;
  local_18._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end(in_stack_ffffffffffffffb8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc0 = (Job *)*ppIVar2;
    if (in_stack_ffffffffffffffc0 != (Job *)0x0) {
      (*(code *)*(IBackend **)((long)(in_stack_ffffffffffffffc0->m_seed).m_data + 8))();
    }
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_18);
  }
  String::~String((String *)in_stack_ffffffffffffffc0);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::~vector(this_00);
  Job::~Job(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

inline ~MinerPrivate()
    {
        delete timer;

        for (IBackend *backend : backends) {
            delete backend;
        }
    }